

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xreq_test.c
# Opt level: O1

void test_xreq_recv_header(void)

{
  nng_msg *msg;
  nng_err nVar1;
  int iVar2;
  uint32_t v;
  char *pcVar3;
  size_t sVar4;
  nng_pipe local_3c;
  nng_pipe local_38;
  nng_pipe p1;
  nng_pipe p2;
  uint32_t id;
  nng_socket rep;
  nng_socket req;
  nng_msg *m;
  
  nVar1 = nng_rep0_open_raw((nng_socket *)&p2);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                         ,0xf8,"%s: expected success, got %s (%d)","nng_rep0_open_raw(&rep)",pcVar3,
                         nVar1);
  if (iVar2 != 0) {
    nVar1 = nng_req0_open_raw((nng_socket *)&id);
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                           ,0xf9,"%s: expected success, got %s (%d)","nng_req0_open_raw(&req)",
                           pcVar3,nVar1);
    if (iVar2 != 0) {
      nVar1 = nng_socket_set_ms((nng_socket)id,"recv-timeout",1000);
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                             ,0xfa,"%s: expected success, got %s (%d)",
                             "nng_socket_set_ms(req, NNG_OPT_RECVTIMEO, 1000)",pcVar3,nVar1);
      if (iVar2 != 0) {
        nVar1 = nng_socket_set_ms((nng_socket)id,"send-timeout",1000);
        pcVar3 = nng_strerror(nVar1);
        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                               ,0xfb,"%s: expected success, got %s (%d)",
                               "nng_socket_set_ms(req, NNG_OPT_SENDTIMEO, 1000)",pcVar3,nVar1);
        if (iVar2 != 0) {
          nVar1 = nng_socket_set_ms((nng_socket)p2.id,"send-timeout",1000);
          pcVar3 = nng_strerror(nVar1);
          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                                 ,0xfc,"%s: expected success, got %s (%d)",
                                 "nng_socket_set_ms(rep, NNG_OPT_SENDTIMEO, 1000)",pcVar3,nVar1);
          if (iVar2 != 0) {
            nVar1 = nng_socket_set_ms((nng_socket)p2.id,"send-timeout",1000);
            pcVar3 = nng_strerror(nVar1);
            iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                                   ,0xfd,"%s: expected success, got %s (%d)",
                                   "nng_socket_set_ms(rep, NNG_OPT_SENDTIMEO, 1000)",pcVar3,nVar1);
            if (iVar2 != 0) {
              nVar1 = nuts_marry_ex((nng_socket)id,(nng_socket)p2.id,(char *)0x0,&local_3c,&local_38
                                   );
              pcVar3 = nng_strerror(nVar1);
              iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                                     ,0xff,"%s: expected success, got %s (%d)",
                                     "nuts_marry_ex(req, rep, ((void*)0), &p1, &p2)",pcVar3,nVar1);
              if (iVar2 != 0) {
                nVar1 = nng_msg_alloc((nng_msg **)&rep,0);
                pcVar3 = nng_strerror(nVar1);
                iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                                       ,0x102,"%s: expected success, got %s (%d)",
                                       "nng_msg_alloc(&m, 0)",pcVar3,nVar1);
                msg = _rep;
                if (iVar2 != 0) {
                  v = nng_pipe_id(local_38);
                  nVar1 = nng_msg_header_append_u32(msg,v);
                  pcVar3 = nng_strerror(nVar1);
                  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                                         ,0x103,"%s: expected success, got %s (%d)",
                                         "nng_msg_header_append_u32(m, nng_pipe_id(p2))",pcVar3,
                                         nVar1);
                  if (iVar2 != 0) {
                    nVar1 = nng_msg_header_append_u32(_rep,2);
                    pcVar3 = nng_strerror(nVar1);
                    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                                           ,0x104,"%s: expected success, got %s (%d)",
                                           "nng_msg_header_append_u32(m, 0x2)",pcVar3,nVar1);
                    if (iVar2 != 0) {
                      nVar1 = nng_msg_header_append_u32(_rep,1);
                      pcVar3 = nng_strerror(nVar1);
                      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                                             ,0x105,"%s: expected success, got %s (%d)",
                                             "nng_msg_header_append_u32(m, 0x1)",pcVar3,nVar1);
                      if (iVar2 != 0) {
                        nVar1 = nng_msg_header_append_u32(_rep,0x80000123);
                        pcVar3 = nng_strerror(nVar1);
                        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                                               ,0x106,"%s: expected success, got %s (%d)",
                                               "nng_msg_header_append_u32(m, 0x80000123u)",pcVar3,
                                               nVar1);
                        if (iVar2 != 0) {
                          nVar1 = nng_sendmsg((nng_socket)p2.id,_rep,0);
                          pcVar3 = nng_strerror(nVar1);
                          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                                                 ,0x108,"%s: expected success, got %s (%d)",
                                                 "nng_sendmsg(rep, m, 0)",pcVar3,nVar1);
                          if (iVar2 != 0) {
                            nVar1 = nng_recvmsg((nng_socket)id,(nng_msg **)&rep,0);
                            pcVar3 = nng_strerror(nVar1);
                            iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                                                  ,0x10a,"%s: expected success, got %s (%d)",
                                                  "nng_recvmsg(req, &m, 0)",pcVar3,nVar1);
                            if (iVar2 != 0) {
                              sVar4 = nng_msg_header_len(_rep);
                              acutest_check_((uint)(sVar4 == 0xc),
                                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                                             ,0x10b,"%s","nng_msg_header_len(m) == 12");
                              nVar1 = nng_msg_header_trim_u32(_rep,&p1.id);
                              pcVar3 = nng_strerror(nVar1);
                              iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                                                  ,0x10c,"%s: expected success, got %s (%d)",
                                                  "nng_msg_header_trim_u32(m, &id)",pcVar3,nVar1);
                              if (iVar2 != 0) {
                                acutest_check_((uint)(p1.id == 2),
                                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                                               ,0x10d,"%s","id == 0x2");
                                nVar1 = nng_msg_header_trim_u32(_rep,&p1.id);
                                pcVar3 = nng_strerror(nVar1);
                                iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                                                  ,0x10e,"%s: expected success, got %s (%d)",
                                                  "nng_msg_header_trim_u32(m, &id)",pcVar3,nVar1);
                                if (iVar2 != 0) {
                                  acutest_check_((uint)(p1.id == 1),
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                                                 ,0x10f,"%s","id == 0x1");
                                  nVar1 = nng_msg_header_trim_u32(_rep,&p1.id);
                                  pcVar3 = nng_strerror(nVar1);
                                  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                                                  ,0x110,"%s: expected success, got %s (%d)",
                                                  "nng_msg_header_trim_u32(m, &id)",pcVar3,nVar1);
                                  if (iVar2 != 0) {
                                    acutest_check_((uint)(p1.id == 0x80000123),
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                                                  ,0x111,"%s","id == 0x80000123u");
                                    nng_msg_free(_rep);
                                    nVar1 = nng_socket_close((nng_socket)id);
                                    pcVar3 = nng_strerror(nVar1);
                                    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                                                  ,0x115,"%s: expected success, got %s (%d)",
                                                  "nng_socket_close(req)",pcVar3,nVar1);
                                    if (iVar2 != 0) {
                                      nVar1 = nng_socket_close((nng_socket)p2.id);
                                      pcVar3 = nng_strerror(nVar1);
                                      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                                                  ,0x116,"%s: expected success, got %s (%d)",
                                                  "nng_socket_close(rep)",pcVar3,nVar1);
                                      if (iVar2 != 0) {
                                        return;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

static void
test_xreq_recv_header(void)
{
	nng_socket rep;
	nng_socket req;
	nng_msg   *m;
	nng_pipe   p1, p2;
	uint32_t   id;

	NUTS_PASS(nng_rep0_open_raw(&rep));
	NUTS_PASS(nng_req0_open_raw(&req));
	NUTS_PASS(nng_socket_set_ms(req, NNG_OPT_RECVTIMEO, 1000));
	NUTS_PASS(nng_socket_set_ms(req, NNG_OPT_SENDTIMEO, 1000));
	NUTS_PASS(nng_socket_set_ms(rep, NNG_OPT_SENDTIMEO, 1000));
	NUTS_PASS(nng_socket_set_ms(rep, NNG_OPT_SENDTIMEO, 1000));

	NUTS_MARRY_EX(req, rep, NULL, &p1, &p2);

	// Simulate a few hops.
	NUTS_PASS(nng_msg_alloc(&m, 0));
	NUTS_PASS(nng_msg_header_append_u32(m, nng_pipe_id(p2)));
	NUTS_PASS(nng_msg_header_append_u32(m, 0x2));
	NUTS_PASS(nng_msg_header_append_u32(m, 0x1));
	NUTS_PASS(nng_msg_header_append_u32(m, 0x80000123u));

	NUTS_PASS(nng_sendmsg(rep, m, 0));

	NUTS_PASS(nng_recvmsg(req, &m, 0));
	NUTS_TRUE(nng_msg_header_len(m) == 12);
	NUTS_PASS(nng_msg_header_trim_u32(m, &id));
	NUTS_TRUE(id == 0x2);
	NUTS_PASS(nng_msg_header_trim_u32(m, &id));
	NUTS_TRUE(id == 0x1);
	NUTS_PASS(nng_msg_header_trim_u32(m, &id));
	NUTS_TRUE(id == 0x80000123u);

	nng_msg_free(m);

	NUTS_CLOSE(req);
	NUTS_CLOSE(rep);
}